

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigrecord_r.hh
# Opt level: O0

void avro::codec_traits<testgen_r::RootRecord>::decode(Decoder *d,RootRecord *v)

{
  bool bVar1;
  Decoder *d_00;
  reference puVar2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  long in_RDI;
  const_iterator it;
  vector<unsigned_long,_std::allocator<unsigned_long>_> fo;
  ResolvingDecoder *rd;
  Nested *in_stack_ffffffffffffff98;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffb0;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_38 [4];
  Decoder *__x;
  
  if (in_RDI == 0) {
    d_00 = (Decoder *)0x0;
  }
  else {
    d_00 = (Decoder *)__dynamic_cast(in_RDI,&Decoder::typeinfo,&ResolvingDecoder::typeinfo,0);
  }
  if (d_00 == (Decoder *)0x0) {
    decode<long>((Decoder *)0x0,(long *)in_stack_ffffffffffffff98);
    decode<std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>>
              (d_00,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     *)in_stack_ffffffffffffff98);
    decode<testgen_r::Nested>(d_00,in_stack_ffffffffffffff98);
    decode<std::map<std::__cxx11::string,testgen_r::Nested,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,testgen_r::Nested>>>>
              (d_00,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testgen_r::Nested,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testgen_r::Nested>_>_>
                     *)in_stack_ffffffffffffff98);
    decode<testgen_r::WithDefaultValue>(d_00,(WithDefaultValue *)in_stack_ffffffffffffff98);
    decode<testgen_r::_bigrecord_r_Union__0__>
              (d_00,(_bigrecord_r_Union__0__ *)in_stack_ffffffffffffff98);
    decode<testgen_r::_bigrecord_r_Union__1__>
              (d_00,(_bigrecord_r_Union__1__ *)in_stack_ffffffffffffff98);
    decode<std::vector<double,std::allocator<double>>>
              (d_00,(vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff98);
    decode<testgen_r::ExampleEnum>(d_00,(ExampleEnum *)in_stack_ffffffffffffff98);
    decode<testgen_r::_bigrecord_r_Union__2__>
              (d_00,(_bigrecord_r_Union__2__ *)in_stack_ffffffffffffff98);
    decode<testgen_r::_bigrecord_r_Union__3__>
              (d_00,(_bigrecord_r_Union__3__ *)in_stack_ffffffffffffff98);
    decode<bool>(d_00,(bool *)in_stack_ffffffffffffff98);
    decode<testgen_r::Nested>(d_00,in_stack_ffffffffffffff98);
    decode<testgen_r::RecordWithDefault>(d_00,(RecordWithDefault *)in_stack_ffffffffffffff98);
    decode<boost::array<unsigned_char,16ul>>
              (d_00,(array<unsigned_char,_16UL> *)in_stack_ffffffffffffff98);
    decode<int>(d_00,(int *)in_stack_ffffffffffffff98);
    decode<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              (d_00,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_ffffffffffffff98);
  }
  else {
    __x = d_00;
    (*(code *)(*(unsigned_long **)d_00)[0x17])();
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (in_RSI,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)__x);
    local_38[0]._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                    in_stack_ffffffffffffff98);
    while( true ) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff98)
      ;
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)d_00,(__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                  *)in_stack_ffffffffffffff98);
      if (!bVar1) break;
      puVar2 = __gnu_cxx::
               __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(local_38);
      in_stack_ffffffffffffff98 = (Nested *)*puVar2;
      switch(in_stack_ffffffffffffff98) {
      case (Nested *)0x0:
        decode<long>(d_00,(long *)in_stack_ffffffffffffff98);
        break;
      case (Nested *)0x1:
        decode<std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>>
                  (d_00,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                         *)in_stack_ffffffffffffff98);
        break;
      case (Nested *)0x2:
        decode<testgen_r::Nested>(d_00,in_stack_ffffffffffffff98);
        break;
      case (Nested *)0x3:
        decode<std::map<std::__cxx11::string,testgen_r::Nested,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,testgen_r::Nested>>>>
                  (d_00,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testgen_r::Nested,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testgen_r::Nested>_>_>
                         *)in_stack_ffffffffffffff98);
        break;
      case (Nested *)0x4:
        decode<testgen_r::WithDefaultValue>(d_00,(WithDefaultValue *)in_stack_ffffffffffffff98);
        break;
      case (Nested *)0x5:
        decode<testgen_r::_bigrecord_r_Union__0__>
                  (d_00,(_bigrecord_r_Union__0__ *)in_stack_ffffffffffffff98);
        break;
      case (Nested *)0x6:
        decode<testgen_r::_bigrecord_r_Union__1__>
                  (d_00,(_bigrecord_r_Union__1__ *)in_stack_ffffffffffffff98);
        break;
      case (Nested *)0x7:
        decode<std::vector<double,std::allocator<double>>>
                  (d_00,(vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff98);
        break;
      case (Nested *)0x8:
        decode<testgen_r::ExampleEnum>(d_00,(ExampleEnum *)in_stack_ffffffffffffff98);
        break;
      case (Nested *)0x9:
        decode<testgen_r::_bigrecord_r_Union__2__>
                  (d_00,(_bigrecord_r_Union__2__ *)in_stack_ffffffffffffff98);
        break;
      case (Nested *)0xa:
        decode<testgen_r::_bigrecord_r_Union__3__>
                  (d_00,(_bigrecord_r_Union__3__ *)in_stack_ffffffffffffff98);
        break;
      case (Nested *)0xb:
        decode<bool>(d_00,(bool *)in_stack_ffffffffffffff98);
        break;
      case (Nested *)0xc:
        decode<testgen_r::Nested>(d_00,in_stack_ffffffffffffff98);
        break;
      case (Nested *)0xd:
        decode<testgen_r::RecordWithDefault>(d_00,(RecordWithDefault *)in_stack_ffffffffffffff98);
        break;
      case (Nested *)0xe:
        decode<boost::array<unsigned_char,16ul>>
                  (d_00,(array<unsigned_char,_16UL> *)in_stack_ffffffffffffff98);
        break;
      case (Nested *)0xf:
        decode<int>(d_00,(int *)in_stack_ffffffffffffff98);
        break;
      case (Nested *)0x10:
        decode<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  (d_00,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        in_stack_ffffffffffffff98);
      }
      __gnu_cxx::
      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(local_38);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(in_stack_ffffffffffffffb0);
  }
  return;
}

Assistant:

static void decode(Decoder& d, testgen_r::RootRecord& v) {
        if (avro::ResolvingDecoder *rd =
            dynamic_cast<avro::ResolvingDecoder *>(&d)) {
            const std::vector<size_t> fo = rd->fieldOrder();
            for (std::vector<size_t>::const_iterator it = fo.begin();
                it != fo.end(); ++it) {
                switch (*it) {
                case 0:
                    avro::decode(d, v.mylong);
                    break;
                case 1:
                    avro::decode(d, v.mymap);
                    break;
                case 2:
                    avro::decode(d, v.nestedrecord);
                    break;
                case 3:
                    avro::decode(d, v.recordmap);
                    break;
                case 4:
                    avro::decode(d, v.withDefaultValue);
                    break;
                case 5:
                    avro::decode(d, v.union1WithDefaultValue);
                    break;
                case 6:
                    avro::decode(d, v.union2WithDefaultValue);
                    break;
                case 7:
                    avro::decode(d, v.myarray);
                    break;
                case 8:
                    avro::decode(d, v.myenum);
                    break;
                case 9:
                    avro::decode(d, v.myunion);
                    break;
                case 10:
                    avro::decode(d, v.anotherunion);
                    break;
                case 11:
                    avro::decode(d, v.mybool);
                    break;
                case 12:
                    avro::decode(d, v.anothernested);
                    break;
                case 13:
                    avro::decode(d, v.rwd);
                    break;
                case 14:
                    avro::decode(d, v.myfixed);
                    break;
                case 15:
                    avro::decode(d, v.anotherint);
                    break;
                case 16:
                    avro::decode(d, v.bytes);
                    break;
                default:
                    break;
                }
            }
        } else {
            avro::decode(d, v.mylong);
            avro::decode(d, v.mymap);
            avro::decode(d, v.nestedrecord);
            avro::decode(d, v.recordmap);
            avro::decode(d, v.withDefaultValue);
            avro::decode(d, v.union1WithDefaultValue);
            avro::decode(d, v.union2WithDefaultValue);
            avro::decode(d, v.myarray);
            avro::decode(d, v.myenum);
            avro::decode(d, v.myunion);
            avro::decode(d, v.anotherunion);
            avro::decode(d, v.mybool);
            avro::decode(d, v.anothernested);
            avro::decode(d, v.rwd);
            avro::decode(d, v.myfixed);
            avro::decode(d, v.anotherint);
            avro::decode(d, v.bytes);
        }
    }